

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

gravity_closure_t * gravity_class_lookup_constructor(gravity_class_t *c,uint32_t nparams)

{
  gravity_class_t *pgVar1;
  size_t sVar2;
  gravity_value_t *pgVar3;
  gravity_value_t key;
  gravity_value_t key_00;
  gravity_value_t key_01;
  char name [256];
  gravity_class_t *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  gravity_class_t **local_140;
  uint32_t local_138;
  uint32_t local_134;
  undefined4 local_130;
  gravity_class_t *local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  char *local_f8;
  uint32_t local_f0;
  undefined8 local_ec;
  
  if (c->xdata == (void *)0x0) {
    local_128 = gravity_class_string;
    local_120 = 0;
    uStack_118 = 0;
    local_110 = 0;
    uStack_108 = 0;
    local_100 = 0;
    local_f8 = "init";
    local_ec = 4;
    local_f0 = gravity_hash_compute_buffer("init",4);
    pgVar1 = gravity_class_string;
    do {
      key_00.field_1.p = (gravity_object_t *)&local_128;
      key_00.isa = pgVar1;
      pgVar3 = gravity_hash_lookup(c->htable,key_00);
      if (pgVar3 != (gravity_value_t *)0x0) goto LAB_0012b7bc;
      c = c->superclass;
    } while (c != (gravity_class_s *)0x0);
  }
  else if (nparams == 0) {
    local_128 = gravity_class_string;
    local_120 = 0;
    uStack_118 = 0;
    local_110 = 0;
    uStack_108 = 0;
    local_100 = 0;
    local_f8 = "$init";
    local_ec = 5;
    local_f0 = gravity_hash_compute_buffer("$init",5);
    pgVar1 = gravity_class_string;
    do {
      key_01.field_1.p = (gravity_object_t *)&local_128;
      key_01.isa = pgVar1;
      pgVar3 = gravity_hash_lookup(c->htable,key_01);
      if (pgVar3 != (gravity_value_t *)0x0) goto LAB_0012b7bc;
      c = c->superclass;
    } while (c != (gravity_class_s *)0x0);
  }
  else {
    snprintf((char *)&local_128,0x100,"%s%d","$init",(ulong)nparams);
    local_170 = gravity_class_string;
    local_168 = 0;
    uStack_160 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0;
    local_140 = &local_128;
    sVar2 = strlen((char *)&local_128);
    local_134 = (uint32_t)sVar2;
    local_130 = 0;
    local_138 = gravity_hash_compute_buffer((char *)&local_128,local_134);
    pgVar1 = gravity_class_string;
    do {
      key.field_1.p = (gravity_object_t *)&local_170;
      key.isa = pgVar1;
      pgVar3 = gravity_hash_lookup(c->htable,key);
      if (pgVar3 != (gravity_value_t *)0x0) {
LAB_0012b7bc:
        return (gravity_closure_t *)(pgVar3->field_1).n;
      }
      c = c->superclass;
    } while (c != (gravity_class_s *)0x0);
  }
  return (gravity_closure_t *)0x0;
}

Assistant:

inline gravity_closure_t *gravity_class_lookup_constructor (gravity_class_t *c, uint32_t nparams) {
    if (c->xdata) {
        // bridged class so check for special $initN function
        if (nparams == 0) {
            STATICVALUE_FROM_STRING(key, CLASS_INTERNAL_INIT_NAME, strlen(CLASS_INTERNAL_INIT_NAME));
            return (gravity_closure_t *)gravity_class_lookup(c, key);
        }

        // for bridged classed (which can have more than one init constructor like in objc) the convention is
        // to map each bridged init with a special $initN function (where N>0 is num params)
        char name[256]; snprintf(name, sizeof(name), "%s%d", CLASS_INTERNAL_INIT_NAME, nparams);
        STATICVALUE_FROM_STRING(key, name, strlen(name));
        return (gravity_closure_t *)gravity_class_lookup(c, key);
    }

    // for non bridge classes just check for constructor
    STATICVALUE_FROM_STRING(key, CLASS_CONSTRUCTOR_NAME, strlen(CLASS_CONSTRUCTOR_NAME));
    return (gravity_closure_t *)gravity_class_lookup(c, key);
}